

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

void expect_range(char *function,char *parameter,char *file,int line,unsigned_long minimum,
                 unsigned_long maximum,CheckParameterValue check_function,int count)

{
  void *event;
  
  event = malloc(0x38);
  *(unsigned_long *)((long)event + 0x28) = minimum;
  *(unsigned_long *)((long)event + 0x30) = maximum;
  _expect_check(function,parameter,file,line,check_function,(unsigned_long)event,
                (CheckParameterEvent *)event,count);
  return;
}

Assistant:

static void expect_range(
        const char* const function, const char* const parameter,
        const char* const file, const int line,
        const LargestIntegralType minimum, const LargestIntegralType maximum,
        const CheckParameterValue check_function, const int count) {
    CheckIntegerRange * const check_integer_range =
        (CheckIntegerRange*)malloc(sizeof(*check_integer_range));
    declare_initialize_value_pointer_pointer(check_data, check_integer_range);
    check_integer_range->minimum = minimum;
    check_integer_range->maximum = maximum;
    _expect_check(function, parameter, file, line, check_function,
                  check_data.value, &check_integer_range->event, count);
}